

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::branch_to_continue(CompilerGLSL *this,BlockID from,BlockID to)

{
  bool bVar1;
  uint32_t uVar2;
  BlockID *this_00;
  CFG *this_01;
  BlockID local_8c;
  CFG *local_88;
  CFG *cfg;
  uint32_t local_78;
  byte local_71;
  uint32_t loop_dominator;
  bool outside_control_flow;
  SPIRBlock *from_block;
  undefined1 local_58 [8];
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  usage_counts;
  SPIRBlock *to_block;
  CompilerGLSL *this_local;
  BlockID to_local;
  BlockID from_local;
  
  this_local._0_4_ = to.id;
  this_local._4_4_ = from.id;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
  usage_counts._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
  bVar1 = TypedID<(spirv_cross::Types)6>::operator==
                    ((TypedID<(spirv_cross::Types)6> *)((long)&this_local + 4),
                     (TypedID<(spirv_cross::Types)6> *)&this_local);
  if (!bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
    bVar1 = Compiler::is_continue(&this->super_Compiler,uVar2);
    if (!bVar1) {
      __assert_fail("is_continue(to)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x3390,"void spirv_cross::CompilerGLSL::branch_to_continue(BlockID, BlockID)");
    }
    if (((ulong)usage_counts._M_h._M_single_bucket[0x46]._M_nxt & 0x100) == 0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
      _loop_dominator = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
      local_71 = 0;
      local_78 = 0;
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_loop_dominator->merge_block);
      if (uVar2 == 0) {
        this_00 = &_loop_dominator->loop_dominator;
        TypedID<(spirv_cross::Types)6>::TypedID
                  ((TypedID<(spirv_cross::Types)6> *)((long)&cfg + 4),0xffffffff);
        bVar1 = TypedID<(spirv_cross::Types)6>::operator!=
                          (this_00,(TypedID<(spirv_cross::Types)6> *)((long)&cfg + 4));
        if (bVar1) {
          local_78 = TypedID::operator_cast_to_unsigned_int
                               ((TypedID *)&_loop_dominator->loop_dominator);
        }
      }
      else {
        local_78 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
      }
      if (local_78 != 0) {
        this_01 = Compiler::get_cfg_for_current_function(&this->super_Compiler);
        local_88 = this_01;
        TypedID<(spirv_cross::Types)6>::TypedID(&local_8c,local_78);
        local_71 = CFG::node_terminates_control_flow_in_sub_graph(this_01,local_8c,this_local._4_4_)
        ;
      }
      if ((local_71 & 1) == 0) {
        statement<char_const(&)[10]>(this,(char (*) [10])"continue;");
      }
    }
    else {
      ::std::
      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)local_58,&this->expression_usage_counts);
      emit_block_chain(this,(SPIRBlock *)usage_counts._M_h._M_single_bucket);
      ::std::
      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::operator=(&this->expression_usage_counts,
                  (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_58);
      ::std::
      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)local_58);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::branch_to_continue(BlockID from, BlockID to)
{
	auto &to_block = get<SPIRBlock>(to);
	if (from == to)
		return;

	assert(is_continue(to));
	if (to_block.complex_continue)
	{
		// Just emit the whole block chain as is.
		auto usage_counts = expression_usage_counts;

		emit_block_chain(to_block);

		// Expression usage counts are moot after returning from the continue block.
		expression_usage_counts = usage_counts;
	}
	else
	{
		auto &from_block = get<SPIRBlock>(from);
		bool outside_control_flow = false;
		uint32_t loop_dominator = 0;

		// FIXME: Refactor this to not use the old loop_dominator tracking.
		if (from_block.merge_block)
		{
			// If we are a loop header, we don't set the loop dominator,
			// so just use "self" here.
			loop_dominator = from;
		}
		else if (from_block.loop_dominator != BlockID(SPIRBlock::NoDominator))
		{
			loop_dominator = from_block.loop_dominator;
		}

		if (loop_dominator != 0)
		{
			auto &cfg = get_cfg_for_current_function();

			// For non-complex continue blocks, we implicitly branch to the continue block
			// by having the continue block be part of the loop header in for (; ; continue-block).
			outside_control_flow = cfg.node_terminates_control_flow_in_sub_graph(loop_dominator, from);
		}

		// Some simplification for for-loops. We always end up with a useless continue;
		// statement since we branch to a loop block.
		// Walk the CFG, if we unconditionally execute the block calling continue assuming we're in the loop block,
		// we can avoid writing out an explicit continue statement.
		// Similar optimization to return statements if we know we're outside flow control.
		if (!outside_control_flow)
			statement("continue;");
	}
}